

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::CallOrCast__(void *this,CallOrCast *c)

{
  byte bVar1;
  bool bVar2;
  bool oldWriting;
  CallOrCast *c_local;
  UseCounter *this_local;
  
  bVar2 = pool_ptr<soul::AST::CommaSeparatedList>::operator!=
                    (&(c->super_CallOrCastBase).arguments,(void *)0x0);
  if (bVar2) {
    bVar1 = *(byte *)((long)this + 9);
    *(undefined1 *)((long)this + 9) = 1;
    ASTVisitor::visit((ASTVisitor *)this,c);
    *(byte *)((long)this + 9) = bVar1 & 1;
  }
  return;
}

Assistant:

void visit (AST::CallOrCast& c) override
            {
                if (c.arguments != nullptr)
                {
                    // Since we don't know if this might be a function with all pass-by-ref args, we need
                    // to mark all the args as possibly being written..
                    auto oldWriting = isWriting;
                    isWriting = true;
                    ASTVisitor::visit (c);
                    isWriting = oldWriting;
                }
            }